

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateVariableAccess(ExpressionEvalContext *ctx,ExprVariableAccess *expression)

{
  bool bVar1;
  StackFrame **ppSVar2;
  ExprBase *pEVar3;
  ExprPointerLiteral *target;
  ExprBase *value;
  ExprPointerLiteral *ptr;
  ExprVariableAccess *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar1) &&
     (ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar2)->targetYield != 0)) {
    pEVar3 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar3,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar3;
  }
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    target = FindVariableStorage(ctx,expression->variable,false);
    if (target == (ExprPointerLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      pEVar3 = CreateLoad(ctx,&target->super_ExprBase);
      if (pEVar3 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar3);
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateVariableAccess(ExpressionEvalContext &ctx, ExprVariableAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *ptr = FindVariableStorage(ctx, expression->variable, false);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	return CheckType(expression, value);
}